

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

size_t pbrt::type_size(Type value)

{
  Type value_local;
  size_t local_8;
  
  switch(value) {
  case Invalid:
    local_8 = 0;
    break;
  case UInt8:
    local_8 = 1;
    break;
  case Int8:
    local_8 = 1;
    break;
  case UInt16:
    local_8 = 2;
    break;
  case Int16:
    local_8 = 2;
    break;
  case UInt32:
    local_8 = 4;
    break;
  case Int32:
    local_8 = 4;
    break;
  case UInt64:
    local_8 = 8;
    break;
  case Int64:
    local_8 = 8;
    break;
  case Float16:
    local_8 = 2;
    break;
  case Float32:
    local_8 = 4;
    break;
  case Float64:
    local_8 = 8;
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t type_size(Tensor::Type value) {
    switch (value) {
    case Tensor::Invalid:
        return 0;
        break;
    case Tensor::UInt8:
        return 1;
        break;
    case Tensor::Int8:
        return 1;
        break;
    case Tensor::UInt16:
        return 2;
        break;
    case Tensor::Int16:
        return 2;
        break;
    case Tensor::UInt32:
        return 4;
        break;
    case Tensor::Int32:
        return 4;
        break;
    case Tensor::UInt64:
        return 8;
        break;
    case Tensor::Int64:
        return 8;
        break;
    case Tensor::Float16:
        return 2;
        break;
    case Tensor::Float32:
        return 4;
        break;
    case Tensor::Float64:
        return 8;
        break;
    default:
        return 0;
        break;
    }
}